

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_crc32(uchar *data,size_t length)

{
  uint uVar1;
  size_t sVar2;
  
  uVar1 = 0xffffffff;
  if (7 < length) {
    uVar1 = 0xffffffff;
    do {
      uVar1 = lodepng_crc32_table6[uVar1 >> 8 & 0xff ^ (uint)data[1]] ^
              lodepng_crc32_table7[uVar1 & 0xff ^ (uint)*data] ^
              lodepng_crc32_table5[uVar1 >> 0x10 & 0xff ^ (uint)data[2]] ^
              lodepng_crc32_table4[uVar1 >> 0x18 ^ (uint)data[3]] ^ lodepng_crc32_table3[data[4]] ^
              lodepng_crc32_table2[data[5]] ^ lodepng_crc32_table1[data[6]] ^
              lodepng_crc32_table0[data[7]];
      data = data + 8;
      length = length - 8;
    } while (7 < length);
  }
  if (length != 0) {
    sVar2 = 0;
    do {
      uVar1 = uVar1 >> 8 ^ lodepng_crc32_table0[(byte)(data[sVar2] ^ (byte)uVar1)];
      sVar2 = sVar2 + 1;
    } while (length != sVar2);
  }
  return ~uVar1;
}

Assistant:

unsigned lodepng_crc32(const unsigned char* data, size_t length) {
  /*Using the Slicing by Eight algorithm*/
  unsigned r = 0xffffffffu;
  while(length >= 8) {
    r = lodepng_crc32_table7[(data[0] ^ (r & 0xffu))] ^
        lodepng_crc32_table6[(data[1] ^ ((r >> 8) & 0xffu))] ^
        lodepng_crc32_table5[(data[2] ^ ((r >> 16) & 0xffu))] ^
        lodepng_crc32_table4[(data[3] ^ ((r >> 24) & 0xffu))] ^
        lodepng_crc32_table3[data[4]] ^
        lodepng_crc32_table2[data[5]] ^
        lodepng_crc32_table1[data[6]] ^
        lodepng_crc32_table0[data[7]];
    data += 8;
    length -= 8;
  }
  while(length--) {
    r = lodepng_crc32_table0[(r ^ *data++) & 0xffu] ^ (r >> 8);
  }
  return r ^ 0xffffffffu;
}